

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

void Amap_ManMergeNodeCutsMux(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  Amap_Obj_t *p_00;
  Amap_Lib_t *pAVar1;
  int iVar2;
  uint fComplFanin;
  uint fComplFanin_00;
  uint fComplFanin_01;
  int iVar3;
  Amap_Cut_t AVar4;
  Amap_Obj_t *pFanin;
  Amap_Obj_t *pFanin_00;
  Amap_Obj_t *pFanin_01;
  Amap_Cut_t *pCut0;
  Amap_Cut_t *pCut1;
  Amap_Cut_t *pCut2;
  uint i;
  int i_00;
  Amap_Obj_t *pAVar5;
  int i_01;
  
  p_00 = (Amap_Obj_t *)p->pLib->vRules3;
  pFanin = Amap_ObjFanin0(p,pNode);
  pFanin_00 = Amap_ObjFanin1(p,pNode);
  iVar2 = Abc_Lit2Var(pNode->Fan[2]);
  pFanin_01 = Amap_ManObj(p,iVar2);
  fComplFanin = Amap_ObjFaninC0(pNode);
  fComplFanin_00 = Amap_ObjFaninC1(pNode);
  fComplFanin_01 = Abc_LitIsCompl(pNode->Fan[2]);
  if ((pNode->field_11).pData != (void *)0x0) {
    __assert_fail("pNode->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                  ,0x184,"void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)");
  }
  if (((uint)*(ulong *)pNode & 7) == 6) {
    if ((*(ulong *)pNode >> 0x3e & 1) == 0) {
      for (i = 0; (int)i < *(int *)&p_00->field_0x4; i = i + 4) {
        pAVar5 = p_00;
        iVar2 = Vec_IntEntry((Vec_Int_t *)p_00,i);
        iVar2 = Amap_ManFindCut(pAVar5,pFanin,fComplFanin,iVar2,p->vCuts0);
        if (iVar2 == 0) {
          pAVar5 = p_00;
          iVar2 = Vec_IntEntry((Vec_Int_t *)p_00,i | 1);
          iVar2 = Amap_ManFindCut(pAVar5,pFanin_00,fComplFanin_00,iVar2,p->vCuts1);
          if (iVar2 == 0) {
            pAVar5 = p_00;
            iVar2 = Vec_IntEntry((Vec_Int_t *)p_00,i | 2);
            iVar2 = Amap_ManFindCut(pAVar5,pFanin_01,fComplFanin_01,iVar2,p->vCuts2);
            if (iVar2 == 0) {
              for (iVar2 = 0; iVar2 < p->vCuts0->nSize; iVar2 = iVar2 + 1) {
                pCut0 = (Amap_Cut_t *)Vec_PtrEntry(p->vCuts0,iVar2);
                for (i_00 = 0; i_00 < p->vCuts1->nSize; i_00 = i_00 + 1) {
                  pCut1 = (Amap_Cut_t *)Vec_PtrEntry(p->vCuts1,i_00);
                  i_01 = 0;
                  while( true ) {
                    if (p->vCuts2->nSize <= i_01) break;
                    pCut2 = (Amap_Cut_t *)Vec_PtrEntry(p->vCuts2,i_01);
                    pAVar1 = p->pLib;
                    iVar3 = Vec_IntEntry((Vec_Int_t *)p_00,i | 3);
                    if (pAVar1->pNodes[iVar3].pSets != (Amap_Set_t *)0x0) {
                      if ((((uint)*pCut0 & 0xfffe0000) == 0x20000) &&
                         (((uint)*pCut0 >> 0x10 & 1) != fComplFanin)) {
                        AVar4 = (Amap_Cut_t)Abc_LitNot((int)pCut0[1]);
                        pCut0[1] = AVar4;
                      }
                      if ((((uint)*pCut1 & 0xfffe0000) == 0x20000) &&
                         (((uint)*pCut1 >> 0x10 & 1) != fComplFanin_00)) {
                        AVar4 = (Amap_Cut_t)Abc_LitNot((int)pCut1[1]);
                        pCut1[1] = AVar4;
                      }
                      if ((((uint)*pCut2 & 0xfffe0000) == 0x20000) &&
                         (((uint)*pCut2 >> 0x10 & 1) != fComplFanin_01)) {
                        AVar4 = (Amap_Cut_t)Abc_LitNot((int)pCut2[1]);
                        pCut2[1] = AVar4;
                      }
                      iVar3 = Vec_IntEntry((Vec_Int_t *)p_00,i | 3);
                      Amap_ManCutCreate3(p,pCut0,pCut1,pCut2,iVar3);
                      if ((((uint)*pCut0 & 0xfffe0000) == 0x20000) &&
                         (((uint)*pCut0 >> 0x10 & 1) != fComplFanin)) {
                        AVar4 = (Amap_Cut_t)Abc_LitNot((int)pCut0[1]);
                        pCut0[1] = AVar4;
                      }
                      if ((((uint)*pCut1 & 0xfffe0000) == 0x20000) &&
                         (((uint)*pCut1 >> 0x10 & 1) != fComplFanin_00)) {
                        AVar4 = (Amap_Cut_t)Abc_LitNot((int)pCut1[1]);
                        pCut1[1] = AVar4;
                      }
                      if ((((uint)*pCut2 & 0xfffe0000) == 0x20000) &&
                         (((uint)*pCut2 >> 0x10 & 1) != fComplFanin_01)) {
                        AVar4 = (Amap_Cut_t)Abc_LitNot((int)pCut2[1]);
                        pCut2[1] = AVar4;
                      }
                    }
                    i_01 = i_01 + 1;
                  }
                }
              }
            }
          }
        }
      }
      Amap_ManCutSaveStored(p,pNode);
      p->nCutsUsed = p->nCutsUsed + (*(uint *)&pNode->field_0x8 >> 0xc);
      p->nCutsTried3 =
           p->nCutsTried3 +
           (*(uint *)&pFanin_01->field_0x8 >> 0xc) *
           (*(uint *)&pFanin_00->field_0x8 >> 0xc) * (*(uint *)&pFanin->field_0x8 >> 0xc);
      return;
    }
    __assert_fail("pNode->fRepr == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                  ,0x186,"void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)");
  }
  __assert_fail("pNode->Type == AMAP_OBJ_MUX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMerge.c"
                ,0x185,"void Amap_ManMergeNodeCutsMux(Amap_Man_t *, Amap_Obj_t *)");
}

Assistant:

void Amap_ManMergeNodeCutsMux( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Vec_Int_t * vRules = p->pLib->vRules3;
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Obj_t * pFanin2 = Amap_ObjFanin2( p, pNode );
    int fComplFanin0 = Amap_ObjFaninC0( pNode );
    int fComplFanin1 = Amap_ObjFaninC1( pNode );
    int fComplFanin2 = Amap_ObjFaninC2( pNode );
    Amap_Cut_t * pCut0, * pCut1, * pCut2;
    int x, c0, c1, c2;
    assert( pNode->pData == NULL );
    assert( pNode->Type == AMAP_OBJ_MUX );
    assert( pNode->fRepr == 0 );
    // go through the rules
    for ( x = 0; x < Vec_IntSize(vRules); x += 4 )
    {
        if ( Amap_ManFindCut( pNode, pFanin0, fComplFanin0, Vec_IntEntry(vRules, x), p->vCuts0 ) )
            continue;
        if ( Amap_ManFindCut( pNode, pFanin1, fComplFanin1, Vec_IntEntry(vRules, x+1), p->vCuts1 ) )
            continue;
        if ( Amap_ManFindCut( pNode, pFanin2, fComplFanin2, Vec_IntEntry(vRules, x+2), p->vCuts2 ) )
            continue;
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts0, pCut0, c0 )
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts1, pCut1, c1 )
        Vec_PtrForEachEntry( Amap_Cut_t *, p->vCuts2, pCut2, c2 )
        {
            Amap_Nod_t * pNod = Amap_LibNod( p->pLib, Vec_IntEntry(vRules, x+3) );
            if ( pNod->pSets == NULL )
                continue;
            // complement literals
            if ( pCut0->nFans == 1 && (pCut0->fInv ^ fComplFanin0) )
                pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
            if ( pCut1->nFans == 1 && (pCut1->fInv ^ fComplFanin1) )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            if ( pCut2->nFans == 1 && (pCut2->fInv ^ fComplFanin2) )
                pCut2->Fans[0] = Abc_LitNot(pCut2->Fans[0]);
            // create new cut
            Amap_ManCutCreate3( p, pCut0, pCut1, pCut2, Vec_IntEntry(vRules, x+3) );
            // uncomplement literals
            if ( pCut0->nFans == 1 && (pCut0->fInv ^ fComplFanin0) )
                pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
            if ( pCut1->nFans == 1 && (pCut1->fInv ^ fComplFanin1) )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            if ( pCut2->nFans == 1 && (pCut2->fInv ^ fComplFanin2) )
                pCut2->Fans[0] = Abc_LitNot(pCut2->Fans[0]);
        }
    }
    Amap_ManCutSaveStored( p, pNode );
    p->nCutsUsed += pNode->nCuts;
    p->nCutsTried3 += pFanin0->nCuts * pFanin1->nCuts * pFanin2->nCuts;

//    Amap_ManPrintCuts( pNode );
}